

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O0

size_t __thiscall henson::Scheduler::find_available_procs(Scheduler *this,size_t num_procs)

{
  bool bVar1;
  size_type sVar2;
  vector<bool,_std::allocator<bool>_> *in_RSI;
  vector<bool,_std::allocator<bool>_> *unaff_retaddr;
  size_t i;
  size_t procs;
  reference local_38;
  ulong uVar3;
  ulong __n;
  vector<bool,_std::allocator<bool>_> *this_00;
  
  this_00 = (vector<bool,_std::allocator<bool>_> *)0x0;
  uVar3 = 1;
  while( true ) {
    __n = uVar3;
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(unaff_retaddr);
    if (sVar2 <= uVar3) {
      sVar2 = std::vector<bool,_std::allocator<bool>_>::size(unaff_retaddr);
      return sVar2;
    }
    local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,__n);
    bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_38);
    if (bVar1) {
      this_00 = (vector<bool,_std::allocator<bool>_> *)
                ((long)&(this_00->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
    }
    else {
      this_00 = (vector<bool,_std::allocator<bool>_> *)0x0;
    }
    if (this_00 == in_RSI) break;
    uVar3 = __n + 1;
  }
  return __n - (long)((long)&this_00[-1].super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_end_of_storage + 7);
}

Assistant:

size_t  find_available_procs(size_t num_procs)
        {
            size_t procs = 0;
            for(size_t i = 1; i < available_procs_.size(); ++i)
            {
                if (available_procs_[i])
                    procs++;
                else
                    procs = 0;

                if (procs == num_procs)
                    return i - (procs - 1);
            }

            return available_procs_.size();
        }